

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int compressedSize,
              int maxOutputSize)

{
  char *pcVar1;
  ushort *puVar2;
  char cVar3;
  long lVar4;
  unsigned_long_long uVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  BYTE *s_1;
  size_t __n;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  BYTE *d;
  char *pcVar18;
  char *pcVar19;
  void *__src;
  ushort *puVar20;
  BYTE *s;
  ulong uVar21;
  char *pcVar22;
  BYTE *d_1;
  char *pcVar23;
  int local_88;
  long local_78 [9];
  
  pcVar22 = (char *)LZ4_streamDecode->table[2];
  uVar16 = LZ4_streamDecode->table[3];
  puVar20 = (ushort *)(source + compressedSize);
  pcVar11 = dest + maxOutputSize;
  local_88 = (int)source;
  if (pcVar22 == dest) {
    uVar17 = LZ4_streamDecode->table[1];
    uVar5 = LZ4_streamDecode->table[0];
    local_78[2] = 0;
    local_78[4] = 0;
    local_78[0] = 0;
    local_78[1] = 0;
    local_78[3] = 0xffffffffffffffff;
    local_78[5] = 1;
    local_78[6] = 2;
    local_78[7] = 3;
    if (maxOutputSize == 0) goto LAB_0016a8b5;
    pcVar22 = pcVar22 + -uVar16;
    pcVar1 = pcVar11 + -8;
    pcVar18 = dest;
LAB_0016a5ad:
    uVar6 = *(ushort *)source;
    source = (char *)((long)source + 1);
    uVar8 = (uint)(byte)((byte)uVar6 >> 4);
    sVar13 = (size_t)uVar8;
    if (uVar8 == 0xf) {
      sVar13 = 0xf;
      do {
        uVar7 = *(ushort *)source;
        source = (char *)((long)source + 1);
        sVar13 = sVar13 + (byte)uVar7;
        if ((ushort *)((long)puVar20 - 0xfU) <= source) break;
      } while ((byte)uVar7 == 0xff);
      if ((long)sVar13 < 0) goto LAB_0016a87f;
    }
    pcVar23 = pcVar18 + sVar13;
    puVar2 = (ushort *)((long)source + sVar13);
    if ((pcVar23 <= pcVar11 + -0xc) && (puVar2 <= puVar20 + -4)) {
      do {
        *(undefined8 *)pcVar18 = *(undefined8 *)source;
        pcVar18 = pcVar18 + 8;
        source = (char *)((long)source + 8);
      } while (pcVar18 < pcVar23);
      pcVar9 = pcVar23 + -(ulong)*puVar2;
      source = (char *)(puVar2 + 1);
      if ((uVar17 < 0x10000) && (pcVar9 < pcVar22 + -uVar17)) goto LAB_0016a87f;
      uVar16 = (ulong)((byte)uVar6 & 0xf);
      if (uVar16 == 0xf) {
        uVar16 = 0xf;
        do {
          if ((ushort *)((long)puVar20 - 5U) < source) goto LAB_0016a87f;
          uVar6 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar16 = uVar16 + (byte)uVar6;
        } while ((ulong)(byte)uVar6 == 0xff);
        if ((long)uVar16 < 0) goto LAB_0016a87f;
      }
      pcVar19 = pcVar23 + uVar16 + 4;
      pcVar18 = pcVar19;
      if (pcVar9 < pcVar22) {
        if (pcVar11 + -5 < pcVar19) goto LAB_0016a87f;
        sVar13 = uVar16 + 4;
        uVar21 = (long)pcVar22 - (long)pcVar9;
        __src = (void *)((uVar5 + uVar17) - uVar21);
        uVar16 = sVar13 - uVar21;
        if (sVar13 < uVar21 || uVar16 == 0) {
          memmove(pcVar23,__src,sVar13);
        }
        else {
          memcpy(pcVar23,__src,uVar21);
          pcVar18 = pcVar23 + uVar21;
          pcVar23 = pcVar22;
          if ((ulong)((long)pcVar18 - (long)pcVar22) < uVar16) {
            for (; pcVar18 < pcVar19; pcVar18 = pcVar18 + 1) {
              *pcVar18 = *pcVar23;
              pcVar23 = pcVar23 + 1;
            }
          }
          else {
            memcpy(pcVar18,pcVar22,uVar16);
            pcVar18 = pcVar19;
          }
        }
      }
      else {
        lVar14 = (long)pcVar23 - (long)pcVar9;
        if (lVar14 < 8) {
          lVar4 = *(long *)(&DAT_0016f030 + lVar14 * 8);
          pcVar10 = pcVar9 + (lVar4 - local_78[lVar14]);
          *pcVar23 = *pcVar9;
          pcVar23[1] = pcVar9[1];
          pcVar23[2] = pcVar9[2];
          pcVar23[3] = pcVar9[3];
          *(undefined4 *)(pcVar23 + 4) = *(undefined4 *)(pcVar9 + lVar4);
        }
        else {
          *(undefined8 *)pcVar23 = *(undefined8 *)pcVar9;
          pcVar10 = pcVar9 + 8;
        }
        pcVar23 = pcVar23 + 8;
        if (pcVar11 + -0xc < pcVar19) {
          if (pcVar11 + -5 < pcVar19) goto LAB_0016a87f;
          pcVar9 = pcVar10;
          pcVar15 = pcVar23;
          if (pcVar23 < pcVar1) {
            do {
              *(undefined8 *)pcVar15 = *(undefined8 *)pcVar9;
              pcVar15 = pcVar15 + 8;
              pcVar9 = pcVar9 + 8;
            } while (pcVar15 < pcVar1);
            pcVar10 = pcVar10 + ((long)pcVar1 - (long)pcVar23);
            pcVar23 = pcVar1;
          }
          for (; pcVar23 < pcVar19; pcVar23 = pcVar23 + 1) {
            cVar3 = *pcVar10;
            pcVar10 = pcVar10 + 1;
            *pcVar23 = cVar3;
          }
        }
        else {
          do {
            *(undefined8 *)pcVar23 = *(undefined8 *)pcVar10;
            pcVar23 = pcVar23 + 8;
            pcVar10 = pcVar10 + 8;
          } while (pcVar23 < pcVar19);
        }
      }
      goto LAB_0016a5ad;
    }
    if ((puVar2 == puVar20) && (pcVar23 <= pcVar11)) {
      memcpy(pcVar18,source,sVar13);
      uVar8 = (int)pcVar23 - (int)dest;
      goto LAB_0016a887;
    }
LAB_0016a87f:
    uVar8 = ~(uint)source + local_88;
LAB_0016a887:
    if ((int)uVar8 < 1) {
      return uVar8;
    }
    LZ4_streamDecode->table[3] = LZ4_streamDecode->table[3] + (ulong)uVar8;
    pcVar22 = (char *)((ulong)uVar8 + LZ4_streamDecode->table[2]);
  }
  else {
    LZ4_streamDecode->table[1] = uVar16;
    LZ4_streamDecode->table[0] = (long)pcVar22 - uVar16;
    local_78[2] = 0;
    local_78[4] = 0;
    local_78[0] = 0;
    local_78[1] = 0;
    local_78[3] = 0xffffffffffffffff;
    local_78[5] = 1;
    local_78[6] = 2;
    local_78[7] = 3;
    if (maxOutputSize == 0) {
LAB_0016a8b5:
      if (compressedSize == 1) {
        return -(uint)(*source != '\0');
      }
      return -1;
    }
    pcVar1 = pcVar11 + -8;
    pcVar18 = dest;
LAB_0016a2a4:
    sVar12 = 0xf;
    uVar6 = *(ushort *)source;
    source = (char *)((long)source + 1);
    uVar8 = (uint)(byte)((byte)uVar6 >> 4);
    __n = (size_t)uVar8;
    sVar13 = sVar12;
    if (uVar8 == 0xf) {
      do {
        uVar7 = *(ushort *)source;
        source = (char *)((long)source + 1);
        __n = sVar13 + (byte)uVar7;
        if ((ushort *)((long)puVar20 - 0xfU) <= source) break;
        sVar13 = __n;
      } while ((byte)uVar7 == 0xff);
      if ((long)__n < 0) goto LAB_0016a85e;
    }
    pcVar23 = pcVar18 + __n;
    puVar2 = (ushort *)((long)source + __n);
    if ((pcVar23 <= pcVar11 + -0xc) && (puVar2 <= puVar20 + -4)) {
      do {
        *(undefined8 *)pcVar18 = *(undefined8 *)source;
        pcVar18 = pcVar18 + 8;
        source = (char *)((long)source + 8);
      } while (pcVar18 < pcVar23);
      pcVar9 = pcVar23 + -(ulong)*puVar2;
      source = (char *)(puVar2 + 1);
      if ((uVar16 < 0x10000) && (pcVar9 < dest + -uVar16)) goto LAB_0016a85e;
      sVar13 = (size_t)((byte)uVar6 & 0xf);
      if (sVar13 == 0xf) {
        do {
          if ((ushort *)((long)puVar20 - 5U) < source) goto LAB_0016a85e;
          uVar6 = *(ushort *)source;
          source = (char *)((long)source + 1);
          sVar12 = sVar12 + (byte)uVar6;
        } while ((ulong)(byte)uVar6 == 0xff);
        sVar13 = sVar12;
        if ((long)sVar12 < 0) goto LAB_0016a85e;
      }
      pcVar19 = pcVar23 + sVar13 + 4;
      pcVar18 = pcVar19;
      if (pcVar9 < dest) {
        if (pcVar11 + -5 < pcVar19) goto LAB_0016a85e;
        sVar13 = sVar13 + 4;
        uVar21 = (long)dest - (long)pcVar9;
        uVar17 = sVar13 - uVar21;
        if (sVar13 < uVar21 || uVar17 == 0) {
          memmove(pcVar23,pcVar22 + -uVar21,sVar13);
        }
        else {
          memcpy(pcVar23,pcVar22 + -uVar21,uVar21);
          pcVar18 = pcVar23 + uVar21;
          pcVar23 = dest;
          if ((ulong)((long)pcVar18 - (long)dest) < uVar17) {
            for (; pcVar18 < pcVar19; pcVar18 = pcVar18 + 1) {
              *pcVar18 = *pcVar23;
              pcVar23 = pcVar23 + 1;
            }
          }
          else {
            memcpy(pcVar18,dest,uVar17);
            pcVar18 = pcVar19;
          }
        }
      }
      else {
        lVar14 = (long)pcVar23 - (long)pcVar9;
        if (lVar14 < 8) {
          lVar4 = *(long *)(&DAT_0016f030 + lVar14 * 8);
          pcVar10 = pcVar9 + (lVar4 - local_78[lVar14]);
          *pcVar23 = *pcVar9;
          pcVar23[1] = pcVar9[1];
          pcVar23[2] = pcVar9[2];
          pcVar23[3] = pcVar9[3];
          *(undefined4 *)(pcVar23 + 4) = *(undefined4 *)(pcVar9 + lVar4);
        }
        else {
          *(undefined8 *)pcVar23 = *(undefined8 *)pcVar9;
          pcVar10 = pcVar9 + 8;
        }
        pcVar23 = pcVar23 + 8;
        if (pcVar11 + -0xc < pcVar19) {
          if (pcVar11 + -5 < pcVar19) goto LAB_0016a85e;
          pcVar9 = pcVar10;
          pcVar15 = pcVar23;
          if (pcVar23 < pcVar1) {
            do {
              *(undefined8 *)pcVar15 = *(undefined8 *)pcVar9;
              pcVar15 = pcVar15 + 8;
              pcVar9 = pcVar9 + 8;
            } while (pcVar15 < pcVar1);
            pcVar10 = pcVar10 + ((long)pcVar1 - (long)pcVar23);
            pcVar23 = pcVar1;
          }
          for (; pcVar23 < pcVar19; pcVar23 = pcVar23 + 1) {
            cVar3 = *pcVar10;
            pcVar10 = pcVar10 + 1;
            *pcVar23 = cVar3;
          }
        }
        else {
          do {
            *(undefined8 *)pcVar23 = *(undefined8 *)pcVar10;
            pcVar23 = pcVar23 + 8;
            pcVar10 = pcVar10 + 8;
          } while (pcVar23 < pcVar19);
        }
      }
      goto LAB_0016a2a4;
    }
    if ((puVar2 == puVar20) && (pcVar23 <= pcVar11)) {
      memcpy(pcVar18,source,__n);
      uVar8 = (int)pcVar23 - (int)dest;
      goto LAB_0016a866;
    }
LAB_0016a85e:
    uVar8 = ~(uint)source + local_88;
LAB_0016a866:
    if ((int)uVar8 < 1) {
      return uVar8;
    }
    LZ4_streamDecode->table[3] = (ulong)uVar8;
    pcVar22 = dest + uVar8;
  }
  LZ4_streamDecode->table[2] = (unsigned_long_long)pcVar22;
  return uVar8;
}

Assistant:

int LZ4_decompress_safe_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    LZ4_streamDecode_t_internal* lz4sd = (LZ4_streamDecode_t_internal*) LZ4_streamDecode;
    int result;

    if (lz4sd->prefixEnd == (BYTE*)dest)
    {
        result = LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                        endOnInputSize, full, 0,
                                        usingExtDict, lz4sd->prefixEnd - lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += result;
        lz4sd->prefixEnd  += result;
    }
    else
    {
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                        endOnInputSize, full, 0,
                                        usingExtDict, (BYTE*)dest, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = result;
        lz4sd->prefixEnd  = (BYTE*)dest + result;
    }

    return result;
}